

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

bool __thiscall
slang::parsing::Preprocessor::shouldTakeElseBranch
          (Preprocessor *this,SourceLocation location,ConditionalDirectiveExpressionSyntax *expr)

{
  bool bVar1;
  reference pBVar2;
  size_type sVar3;
  SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *this_00;
  reference pBVar4;
  long in_RDX;
  SourceLocation in_RDI;
  bool taken;
  ConditionalDirectiveExpressionSyntax *in_stack_00000020;
  Preprocessor *in_stack_00000028;
  BranchEntry *branch;
  bool local_61;
  Preprocessor *in_stack_ffffffffffffffa0;
  DiagCode in_stack_ffffffffffffffb4;
  uint uVar5;
  byte bVar6;
  
  bVar1 = SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::empty
                    ((SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *)
                     ((long)in_RDI + 0x120));
  if (bVar1) {
    addDiag(in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb4,in_RDI);
    return true;
  }
  pBVar2 = SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::back
                     ((SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *)
                      ((long)in_RDI + 0x120));
  if ((pBVar2->hasElse & 1U) != 0) {
    addDiag(in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb4,in_RDI);
    return true;
  }
  uVar5 = 0;
  if ((pBVar2->anyTaken & 1U) == 0) {
    sVar3 = SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::size
                      ((SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *)
                       ((long)in_RDI + 0x120));
    if (sVar3 != 1) {
      this_00 = (SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *)((long)in_RDI + 0x120)
      ;
      sVar3 = SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::size
                        ((SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *)
                         ((long)in_RDI + 0x120));
      pBVar4 = SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::operator[]
                         (this_00,sVar3 - 2);
      if ((pBVar4->currentActive & 1U) == 0) goto LAB_002bea0c;
    }
    local_61 = true;
    if (in_RDX != 0) {
      local_61 = evalConditionalExpr(in_stack_00000028,in_stack_00000020);
    }
    uVar5 = (uint)local_61 << 0x18;
  }
LAB_002bea0c:
  bVar6 = (byte)(uVar5 >> 0x18);
  pBVar2->currentActive = (bool)(bVar6 & 1);
  pBVar2->anyTaken = (pBVar2->anyTaken & 1U) != 0 || (uVar5 & 0x1000000) != 0;
  pBVar2->hasElse = (bool)((in_RDX != 0 ^ 0xffU) & 1);
  return (bool)(bVar6 & 1);
}

Assistant:

bool Preprocessor::shouldTakeElseBranch(SourceLocation location,
                                        const syntax::ConditionalDirectiveExpressionSyntax* expr) {
    // empty stack is an error
    if (branchStack.empty()) {
        addDiag(diag::UnexpectedConditionalDirective, location);
        return true;
    }

    // if we already had an else for this branch, we can't have any more elseifs
    BranchEntry& branch = branchStack.back();
    if (branch.hasElse) {
        addDiag(diag::UnexpectedConditionalDirective, location);
        return true;
    }

    // if part of this branch has already been taken, we can't take this one
    bool taken = false;
    if (!branch.anyTaken) {
        // only take this branch if we're the only one in the stack, or our parent is active
        if (branchStack.size() == 1 || branchStack[branchStack.size() - 2].currentActive)
            taken = !expr || evalConditionalExpr(*expr);
    }

    branch.currentActive = taken;
    branch.anyTaken |= taken;
    branch.hasElse = !expr;
    return taken;
}